

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O3

void __thiscall
Centaurus::LookaheadDFA<char>::filter_nodes
          (LookaheadDFA<char> *this,vector<bool,_std::allocator<bool>_> *mask)

{
  uint uVar1;
  value_type *pvVar2;
  pointer pNVar3;
  pointer pLVar4;
  pointer pLVar5;
  ulong uVar6;
  int iVar7;
  NFATransition<char> *t;
  value_type *__x;
  pointer pLVar8;
  LDFAState<char> *n;
  NFATransition<char> *t_1;
  pointer pNVar9;
  ulong uVar10;
  vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_> nodes;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> filtered;
  vector<int,_std::allocator<int>_> index_map;
  vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_> local_88;
  LookaheadDFA<char> *local_70;
  vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  local_88.
  super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             ((long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                    super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                    super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333,
             (allocator_type *)&local_68);
  pLVar5 = (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
           super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pLVar8 = (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
           super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)pLVar5 - (long)pLVar8 >> 4) * -0x3333333333333333 -
      ((ulong)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) != 0) {
    __assert_fail("m_states.size() == mask.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/LookaheadDFA.hpp"
                  ,0x12e,
                  "void Centaurus::LookaheadDFA<char>::filter_nodes(const std::vector<bool> &) [TCHAR = char]"
                 );
  }
  pLVar4 = local_88.
           super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
  _M_impl.super__Vector_impl_data._M_start = pLVar8;
  local_68.
  super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pLVar5;
  if (pLVar5 != pLVar8) {
    uVar10 = 0;
    iVar7 = 0;
    local_70 = this;
    do {
      if (((mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6 & 0x3ffffff] >> (uVar10 & 0x3f) & 1)
          == 0) {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar10] = -1;
      }
      else {
        local_68.
        super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68.
        super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __x = pLVar8[uVar10].
              super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
              .m_transitions.
              super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = pLVar8[uVar10].
                 super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                 .m_transitions.
                 super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (__x != pvVar2) {
          do {
            uVar1 = __x->m_dest;
            if (((int)uVar1 < 0) ||
               (((mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                 ._M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1)
                != 0)) {
              std::
              vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
              ::push_back((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                           *)&local_68,__x);
            }
            __x = __x + 1;
          } while (__x != pvVar2);
          pLVar8 = (local_70->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                   super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pLVar5 = (local_70->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                   super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar6 = ((long)pLVar5 - (long)pLVar8 >> 4) * -0x3333333333333333;
        if (uVar6 < uVar10 || uVar6 - uVar10 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar10);
        }
        std::vector<Centaurus::LDFAState<char>,std::allocator<Centaurus::LDFAState<char>>>::
        emplace_back<Centaurus::LDFAState<char>&,std::vector<Centaurus::NFATransition<char>,std::allocator<Centaurus::NFATransition<char>>>>
                  ((vector<Centaurus::LDFAState<char>,std::allocator<Centaurus::LDFAState<char>>> *)
                   &local_88,pLVar8 + uVar10,
                   (vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                    *)&local_68);
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar10] = iVar7;
        iVar7 = iVar7 + 1;
        std::
        vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
        ~vector((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                 *)&local_68);
        pLVar8 = (local_70->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                 super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar5 = (local_70->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                 super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        this = local_70;
      }
      uVar10 = uVar10 + 1;
      uVar6 = ((long)pLVar5 - (long)pLVar8 >> 4) * -0x3333333333333333;
      pLVar4 = local_88.
               super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_68.
      super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
      _M_impl.super__Vector_impl_data._M_start = pLVar8;
      local_68.
      super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = pLVar5;
    } while (uVar10 <= uVar6 && uVar6 - uVar10 != 0);
  }
  for (; pLVar4 != local_88.
                   super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pLVar4 = pLVar4 + 1) {
    pNVar3 = (pLVar4->
             super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
             ).m_transitions.
             super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pNVar9 = (pLVar4->
                  super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                  ).m_transitions.
                  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pNVar9 != pNVar3; pNVar9 = pNVar9 + 1)
    {
      if (-1 < (long)pNVar9->m_dest) {
        pNVar9->m_dest =
             *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + (long)pNVar9->m_dest * 4);
      }
    }
  }
  local_68.
  super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((NFABase<Centaurus::LDFAState<char>_> *)((long)this + 0x18))->_vptr_NFABase;
  ((NFABase<Centaurus::LDFAState<char>_> *)((long)this + 8))->_vptr_NFABase =
       (_func_int **)
       local_88.
       super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  ((NFABase<Centaurus::LDFAState<char>_> *)((long)this + 0x10))->_vptr_NFABase =
       (_func_int **)
       local_88.
       super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  ((NFABase<Centaurus::LDFAState<char>_> *)((long)this + 0x18))->_vptr_NFABase =
       (_func_int **)
       local_88.
       super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::~vector
            (&local_68);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::~vector
            (&local_88);
  return;
}

Assistant:

void filter_nodes(const std::vector<bool>& mask)
    {
        std::vector<LDFAState<TCHAR> > nodes;
        std::vector<int> index_map(m_states.size());

        assert(m_states.size() == mask.size());

        for (int src_index = 0, dest_index = 0; src_index < m_states.size(); src_index++)
        {
            if (mask[src_index])
            {
                std::vector<LDFATransition<TCHAR> > filtered;
                for (const auto& t : m_states.at(src_index).get_transitions())
                {
                    if (t.dest() < 0)
                    {
                        filtered.push_back(t);
                    }
                    else if (mask[t.dest()])
                    {
                        filtered.push_back(t);
                    }
                }
                nodes.emplace_back(m_states.at(src_index), std::move(filtered));
                index_map[src_index] = dest_index;
                dest_index++;
            }
            else
            {
                index_map[src_index] = -1;
            }
        }

        for (auto& n : nodes)
        {
            for (auto& t : n.get_transitions())
            {
                if (t.dest() >= 0)
                    t.dest(index_map[t.dest()]);
            }
        }
        m_states = std::move(nodes);
    }